

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.cpp
# Opt level: O1

bool Object::Register(ClassInfo *ci)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>_>_>
  *this;
  iterator iVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>
  local_48;
  
  if (classInfoMap_abi_cxx11_ ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>_>_>
       *)0x0) {
    classInfoMap_abi_cxx11_ =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>_>_>
          *)operator_new(0x30);
    p_Var1 = &(classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
    ;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(classInfoMap_abi_cxx11_->_M_t)._M_impl = 0;
    *(undefined8 *)&(classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  if (ci != (ClassInfo *)0x0) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassInfo_*>_>_>
            ::find(&classInfoMap_abi_cxx11_->_M_t,&ci->m_className);
    this = classInfoMap_abi_cxx11_;
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(classInfoMap_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header) {
      paVar2 = &local_48.first.field_2;
      pcVar3 = (ci->m_className)._M_dataplus._M_p;
      local_48.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar3,pcVar3 + (ci->m_className)._M_string_length);
      local_48.second = ci;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ClassInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,ClassInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ClassInfo*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,ClassInfo*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ClassInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,ClassInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ClassInfo*>>>
                  *)this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_48.first._M_dataplus._M_p);
      }
    }
  }
  return true;
}

Assistant:

bool Object::Register(ClassInfo* ci)
{
    if (!classInfoMap)  {
        classInfoMap = new std::map< string, ClassInfo*>();   //这里我们是通过map来存储这个映射的。
    }
    if (ci) {
        if (classInfoMap->find(ci->m_className) == classInfoMap->end()){
            classInfoMap->insert(std::map< string, ClassInfo*>::value_type(ci->m_className, ci)); // 类名 <-> classInfo
        }
    }
    return true;
}